

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyMemBackendInit(SyMemBackend *pBackend,ProcMemError xMemErr,void *pUserData)

{
  int iVar1;
  void *pUserData_local;
  ProcMemError xMemErr_local;
  SyMemBackend *pBackend_local;
  
  SyZero(pBackend,0xb8);
  pBackend->xMemError = xMemErr;
  pBackend->pUserData = pUserData;
  pBackend->pMethods = &sOSAllocMethods;
  if ((pBackend->pMethods->xInit == (_func_int_void_ptr *)0x0) ||
     (iVar1 = (*pBackend->pMethods->xInit)(pBackend->pMethods->pUserData), iVar1 == 0)) {
    pBackend_local._4_4_ = 0;
  }
  else {
    pBackend_local._4_4_ = -10;
  }
  return pBackend_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyMemBackendInit(SyMemBackend *pBackend, ProcMemError xMemErr, void * pUserData)
{
#if defined(UNTRUST)
	if( pBackend == 0 ){
		return SXERR_EMPTY;
	}
#endif
	/* Zero the allocator first */
	SyZero(&(*pBackend), sizeof(SyMemBackend));
	pBackend->xMemError = xMemErr;
	pBackend->pUserData = pUserData;
	/* Switch to the OS memory allocator */
	pBackend->pMethods = &sOSAllocMethods;
	if( pBackend->pMethods->xInit ){
		/* Initialize the backend  */
		if( SXRET_OK != pBackend->pMethods->xInit(pBackend->pMethods->pUserData) ){
			return SXERR_ABORT;
		}
	}
#if defined(UNTRUST)
	pBackend->nMagic = SXMEM_BACKEND_MAGIC;
#endif
	return SXRET_OK;
}